

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_ctrlpt.c
# Opt level: O1

void searchExpired(void *arg)

{
  UpnpClient_Handle Hnd;
  int iVar1;
  int *__ptr;
  Upnp_Handle_Type UVar2;
  ListNode *node;
  ListNode *pLVar3;
  int in_ESI;
  int iVar4;
  void *pvVar5;
  Upnp_FunPtr p_Var6;
  bool bVar7;
  Handle_Info *ctrlpt_info;
  Handle_Info *local_40;
  Upnp_FunPtr local_38;
  Handle_Info **HndInfo;
  
  Hnd = *arg;
  iVar1 = *(int *)((long)arg + 4);
  HndInfo = &local_40;
  local_40 = (Handle_Info *)0x0;
  HandleLock((char *)0x21e,in_ESI);
  UVar2 = GetHandleInfo(Hnd,HndInfo);
  iVar4 = (int)HndInfo;
  if (UVar2 == HND_CLIENT) {
    p_Var6 = local_40->Callback;
    node = ListHead(&local_40->SsdpSearchList);
    bVar7 = node == (ListNode *)0x0;
    if (bVar7) {
LAB_0011cb9f:
      pvVar5 = (void *)0x0;
    }
    else {
      __ptr = (int *)node->item;
      iVar4 = *__ptr;
      local_38 = p_Var6;
      while (iVar4 != iVar1) {
        pLVar3 = ListNext(&local_40->SsdpSearchList,node);
        iVar4 = (int)node;
        bVar7 = pLVar3 == (ListNode *)0x0;
        p_Var6 = local_38;
        if (bVar7) goto LAB_0011cb9f;
        __ptr = (int *)pLVar3->item;
        node = pLVar3;
        iVar4 = *__ptr;
      }
      free(*(void **)(__ptr + 2));
      pvVar5 = *(void **)(__ptr + 4);
      __ptr[2] = 0;
      __ptr[3] = 0;
      free(__ptr);
      ListDelNode(&local_40->SsdpSearchList,node,0);
      iVar4 = (int)node;
      p_Var6 = local_38;
    }
    HandleUnlock((char *)0x235,iVar4);
    if (!bVar7) {
      (*p_Var6)(UPNP_DISCOVERY_SEARCH_TIMEOUT,(void *)0x0,pvVar5);
    }
    free(arg);
  }
  else {
    free(arg);
    HandleUnlock((char *)0x223,iVar4);
  }
  return;
}

Assistant:

static void searchExpired(
	/* [in] . */
	void *arg)
{
	int id = ((SsdpSearchExpArg *)arg)->timeoutEventId;
	int handle = ((SsdpSearchExpArg *)arg)->handle;
	struct Handle_Info *ctrlpt_info = NULL;

	/* remove search Target from list and call client back */
	ListNode *node = NULL;
	SsdpSearchArg *item;
	Upnp_FunPtr ctrlpt_callback;
	void *cookie = NULL;
	int found = 0;

	HandleLock(__FILE__, __LINE__);

	/* remove search target from search list */
	if (GetHandleInfo(handle, &ctrlpt_info) != HND_CLIENT) {
		free(arg);
		HandleUnlock(__FILE__, __LINE__);
		return;
	}
	ctrlpt_callback = ctrlpt_info->Callback;
	node = ListHead(&ctrlpt_info->SsdpSearchList);
	while (node != NULL) {
		item = (SsdpSearchArg *)node->item;
		if (item->timeoutEventId == id) {
			free(item->searchTarget);
			cookie = item->cookie;
			found = 1;
			item->searchTarget = NULL;
			free(item);
			ListDelNode(&ctrlpt_info->SsdpSearchList, node, 0);
			break;
		}
		node = ListNext(&ctrlpt_info->SsdpSearchList, node);
	}
	HandleUnlock(__FILE__, __LINE__);

	if (found)
		ctrlpt_callback(UPNP_DISCOVERY_SEARCH_TIMEOUT, NULL, cookie);

	free(arg);
}